

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_read_scatter_single_test.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  undefined8 *in_RSI;
  char *pcVar6;
  int in_EDI;
  char *__format;
  int rank;
  kvtree *kvtree;
  kvtree *tree;
  char *tmp_str;
  int ranks;
  char prefix [4096];
  char tmp [4096];
  int local_206c;
  undefined8 local_2068;
  undefined8 local_2060;
  undefined1 local_2054 [4];
  undefined8 *local_2050;
  char *local_2048;
  uint local_203c;
  char local_2038 [4095];
  undefined1 local_1039;
  char local_1038 [4095];
  undefined1 local_39;
  
  local_2048 = (char *)0x0;
  local_2068 = 0;
  if (in_EDI != 2) {
    local_2050 = in_RSI;
    puts("USAGE:");
    putchar(10);
    printf("    %s TEMP_DIRECTORY\n",*local_2050);
    putchar(10);
    puts("TEMP_DIRECTORY: A temporary directory to store test files in.");
    exit(1);
  }
  uVar1 = in_RSI[1];
  MPI_Init(local_2054,&local_2050);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_206c);
  MPI_Comm_size(&ompi_mpi_comm_world,&local_203c);
  local_2060 = kvtree_new();
  if (0 < (int)local_203c) {
    uVar5 = 0;
    do {
      sprintf(local_2038,"%d",uVar5);
      kvtree_util_set_str(local_2060,local_2038,"test data");
      uVar3 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar3;
    } while (local_203c != uVar3);
  }
  snprintf(local_1038,0x1000,"%s/PREFIX",uVar1);
  local_39 = 0;
  iVar2 = kvtree_write_to_gather(local_1038,local_2060,local_203c);
  if (iVar2 != 0) {
    kvtree_delete(&local_2060);
LAB_001013c7:
    puts("Error creating files");
    return 1;
  }
  iVar4 = 0;
  snprintf(local_1038,0x1000,"%s/PREFIX.0",uVar1);
  local_39 = 0;
  iVar2 = kvtree_write_to_gather(local_1038,local_2060,local_203c);
  kvtree_delete(&local_2060);
  if (iVar2 != 0) goto LAB_001013c7;
  MPI_Barrier(&ompi_mpi_comm_world);
  if (local_206c != 0) goto LAB_00101495;
  snprintf(local_2038,0x1000,"%s/PREFIX",uVar1);
  local_1039 = 0;
  local_2068 = kvtree_new();
  iVar2 = kvtree_read_scatter_single(local_2038,local_2068);
  if (iVar2 == 0) {
    kvtree_util_get_str(local_2068,"0",&local_2048);
    pcVar6 = local_2048;
    iVar2 = strcmp(local_2048,"test data");
    if (iVar2 != 0) {
      __format = "Got back wrong data (got %s, expected \"test data\")\n";
      goto LAB_00101489;
    }
    kvtree_print(local_2068,4);
    kvtree_delete(&local_2068);
    iVar4 = 0;
    snprintf(local_1038,0x1000,"%s/PREFIX.0.0",uVar1);
    unlink(local_1038);
    local_2068 = kvtree_new();
    iVar2 = kvtree_read_scatter_single(local_2038,local_2068);
    if (iVar2 != 0) goto LAB_00101495;
    puts("kvtree_read_scatter_single() with missing file incorrectly succeeded");
  }
  else {
    __format = "test_kvtree_read_scatter_single failed for %s\n";
    pcVar6 = local_2038;
LAB_00101489:
    printf(__format,pcVar6);
  }
  iVar4 = 1;
LAB_00101495:
  kvtree_delete(&local_2068);
  if (local_206c == 0) {
    snprintf(local_1038,0x1000,"rm -f %s/PREFIX*",uVar1);
    system(local_1038);
  }
  MPI_Finalize();
  return iVar4;
}

Assistant:

int main(int argc, char** argv)
{
  int rc;
  char tmp[PATH_MAX];
  char* prefix_dir;
  char* tmp_str = NULL;
  char prefix[PATH_MAX];
  int rank, ranks;
  kvtree* kvtree = NULL;

  if (argc != 2) {
    printf("USAGE:\n");
    printf("\n");
    printf("    %s TEMP_DIRECTORY\n", argv[0]);
    printf("\n");
    printf("TEMP_DIRECTORY: A temporary directory to store test files in.\n");
    exit(1);
  }

  prefix_dir = argv[1];

  MPI_Init(&argc, &argv);
  MPI_Comm_rank(MPI_COMM_WORLD, &rank);
  MPI_Comm_size(MPI_COMM_WORLD, &ranks);

  /* Create our prefix files */
  rc = create_files(prefix_dir, ranks);
  if (rc != 0) {
    printf("Error creating files\n");
    return 1;
  }

  MPI_Barrier(MPI_COMM_WORLD);

  /* Only read back the file with rank 0 */
  if (rank != 0) {
    rc = 0;
    goto end;
  }

  /* Construct path to our main PREFIX file */
  snprintf(prefix, sizeof(prefix), "%s/PREFIX", prefix_dir);
  prefix[sizeof(prefix) - 1] = '\0';

  /* Read our PREFIX files */
  kvtree = kvtree_new();
  rc = kvtree_read_scatter_single(prefix, kvtree);
  if (rc != KVTREE_SUCCESS) {
    printf("test_kvtree_read_scatter_single failed for %s\n", prefix);
    rc = 1;
    goto end;
  }

  /* Sanity test a value */
  kvtree_util_get_str(kvtree, "0", &tmp_str);
  if (strcmp(tmp_str, "test data") != 0) {
    printf("Got back wrong data (got %s, expected \"test data\")\n", tmp_str);
    rc = 1;
    goto end;
  }
  kvtree_print(kvtree, 4);
  kvtree_delete(&kvtree);

  /*
   * Remove PREFIX.0.0 to induce a failure.
   */
  snprintf(tmp, sizeof(tmp), "%s/PREFIX.0.0", prefix_dir);
  unlink(tmp);

  /* Attempt to call kvtree_read_scatter_single() - it should fail. */
  kvtree = kvtree_new();
  rc = kvtree_read_scatter_single(prefix, kvtree);
  if (rc == KVTREE_SUCCESS) {
    printf("kvtree_read_scatter_single() with missing file incorrectly succeeded\n");
    rc = 1;
  } else {
    /* success */
    rc = 0;
  }

end:
  kvtree_delete(&kvtree);

  if (rank == 0) {
    /* Remove our test files */
    snprintf(tmp, sizeof(tmp), "rm -f %s/PREFIX*", prefix_dir);
    system(tmp);
  }
  MPI_Finalize();

  return rc;
}